

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_name_gen.cxx
# Opt level: O1

int __thiscall xray_re::xr_name_gen::init(xr_name_gen *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  char *__dest;
  void *pvVar2;
  int in_EDX;
  uint uVar3;
  
  sVar1 = strlen((char *)ctx);
  __dest = (char *)operator_new__(sVar1 + 0x10);
  this->m_name = __dest;
  pvVar2 = memcpy(__dest,ctx,sVar1 + 1);
  uVar3 = (uint)sVar1;
  this->m_offset = uVar3;
  if (in_EDX == 0) {
    this->m_next_idx = 0;
    builtin_strncpy(__dest + (sVar1 & 0xffffffff),"0000",5);
  }
  else {
    this->m_next_idx = -1;
    uVar3 = (uint)pvVar2;
  }
  return uVar3;
}

Assistant:

void xr_name_gen::init(const char* pattern, bool mimic_gsc)
{
	size_t size = std::strlen(pattern);
	m_name = new char[size + k_reserved];
	std::memcpy(m_name, pattern, size + 1);
	m_offset = unsigned(size & UINT_MAX);
	if (mimic_gsc) {
		m_next_idx = -1;
	} else {
		m_next_idx = 0;
		std::memcpy(&m_name[m_offset], "0000", 5);
	}
}